

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapecube.cpp
# Opt level: O0

void pzshape::TPZShapeCube::ShapeCorner
               (TPZVec<double> *pt,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double *pdVar1;
  TPZVec<double> *in_RDI;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double col;
  double row;
  TPZFMatrix<double> *this;
  REAL dz [2];
  REAL z [2];
  REAL dy [2];
  REAL y [2];
  REAL dx [2];
  REAL x [2];
  int64_t in_stack_fffffffffffffea0;
  int64_t in_stack_fffffffffffffea8;
  TPZFMatrix<double> *in_stack_fffffffffffffeb0;
  
  pdVar1 = TPZVec<double>::operator[](in_RDI,0);
  dVar2 = (1.0 - *pdVar1) / 2.0;
  pdVar1 = TPZVec<double>::operator[](in_RDI,0);
  dVar3 = (*pdVar1 + 1.0) / 2.0;
  pdVar1 = TPZVec<double>::operator[](in_RDI,1);
  dVar4 = (1.0 - *pdVar1) / 2.0;
  pdVar1 = TPZVec<double>::operator[](in_RDI,1);
  dVar5 = (*pdVar1 + 1.0) / 2.0;
  pdVar1 = TPZVec<double>::operator[](in_RDI,2);
  dVar6 = (1.0 - *pdVar1) / 2.0;
  pdVar1 = TPZVec<double>::operator[](in_RDI,2);
  dVar7 = (*pdVar1 + 1.0) / 2.0;
  pdVar1 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0)
  ;
  *pdVar1 = dVar2 * dVar4 * dVar6;
  pdVar1 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0)
  ;
  *pdVar1 = dVar3 * dVar4 * dVar6;
  pdVar1 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0)
  ;
  *pdVar1 = dVar3 * dVar5 * dVar6;
  col = dVar2 * dVar5 * dVar6;
  pdVar1 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,(int64_t)col);
  *pdVar1 = col;
  row = dVar2 * dVar4 * dVar7;
  pdVar1 = TPZFMatrix<double>::operator()(in_stack_fffffffffffffeb0,(int64_t)row,(int64_t)col);
  *pdVar1 = row;
  this = (TPZFMatrix<double> *)(dVar3 * dVar4 * dVar7);
  pdVar1 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar1 = (double)this;
  pdVar1 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar1 = dVar3 * dVar5 * dVar7;
  pdVar1 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar1 = dVar2 * dVar5 * dVar7;
  pdVar1 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar1 = dVar4 * -0.5 * dVar6;
  pdVar1 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar1 = dVar2 * -0.5 * dVar6;
  pdVar1 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar1 = dVar2 * dVar4 * -0.5;
  pdVar1 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar1 = dVar4 * 0.5 * dVar6;
  pdVar1 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar1 = dVar3 * -0.5 * dVar6;
  pdVar1 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar1 = dVar3 * dVar4 * -0.5;
  pdVar1 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar1 = dVar5 * 0.5 * dVar6;
  pdVar1 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar1 = dVar3 * 0.5 * dVar6;
  pdVar1 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar1 = dVar3 * dVar5 * -0.5;
  pdVar1 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar1 = dVar5 * -0.5 * dVar6;
  pdVar1 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar1 = dVar2 * 0.5 * dVar6;
  pdVar1 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar1 = dVar2 * dVar5 * -0.5;
  pdVar1 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar1 = dVar4 * -0.5 * dVar7;
  pdVar1 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar1 = dVar2 * -0.5 * dVar7;
  pdVar1 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar1 = dVar2 * dVar4 * 0.5;
  pdVar1 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar1 = dVar4 * 0.5 * dVar7;
  pdVar1 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar1 = dVar3 * -0.5 * dVar7;
  pdVar1 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar1 = dVar3 * dVar4 * 0.5;
  pdVar1 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar1 = dVar5 * 0.5 * dVar7;
  pdVar1 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar1 = dVar3 * 0.5 * dVar7;
  pdVar1 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar1 = dVar3 * dVar5 * 0.5;
  pdVar1 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar1 = dVar5 * -0.5 * dVar7;
  pdVar1 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar1 = dVar2 * 0.5 * dVar7;
  pdVar1 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar1 = dVar2 * dVar5 * 0.5;
  return;
}

Assistant:

void TPZShapeCube::ShapeCorner(const TPZVec<REAL> &pt, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi)
{
		
		REAL x[2],dx[2],y[2],dy[2],z[2],dz[2];
		x[0]  = (1.-pt[0])/2.;
		x[1]  = (1.+pt[0])/2.;
		dx[0] = -0.5;
		dx[1] =  0.5;
		y[0]  = (1.-pt[1])/2.;
		y[1]  = (1.+pt[1])/2.;
		dy[0] = -0.5;
		dy[1] =  0.5;
		z[0]  = (1.-pt[2])/2.;
		z[1]  = (1.+pt[2])/2.;
		dz[0] = -0.5;
		dz[1] =  0.5;
		
		phi(0,0)  = x[0]*y[0]*z[0];
		phi(1,0)  = x[1]*y[0]*z[0];
		phi(2,0)  = x[1]*y[1]*z[0];
		phi(3,0)  = x[0]*y[1]*z[0];
		phi(4,0)  = x[0]*y[0]*z[1];
		phi(5,0)  = x[1]*y[0]*z[1];
		phi(6,0)  = x[1]*y[1]*z[1];
		phi(7,0)  = x[0]*y[1]*z[1];
		dphi(0,0) = dx[0]*y[0]*z[0];
		dphi(1,0) = x[0]*dy[0]*z[0];
		dphi(2,0) = x[0]*y[0]*dz[0];
		dphi(0,1) = dx[1]*y[0]*z[0];
		dphi(1,1) = x[1]*dy[0]*z[0];
		dphi(2,1) = x[1]*y[0]*dz[0];
		dphi(0,2) = dx[1]*y[1]*z[0];
		dphi(1,2) = x[1]*dy[1]*z[0];
		dphi(2,2) = x[1]*y[1]*dz[0];
		dphi(0,3) = dx[0]*y[1]*z[0];
		dphi(1,3) = x[0]*dy[1]*z[0];
		dphi(2,3) = x[0]*y[1]*dz[0];
		dphi(0,4) = dx[0]*y[0]*z[1];
		dphi(1,4) = x[0]*dy[0]*z[1];
		dphi(2,4) = x[0]*y[0]*dz[1];
		dphi(0,5) = dx[1]*y[0]*z[1];
		dphi(1,5) = x[1]*dy[0]*z[1];
		dphi(2,5) = x[1]*y[0]*dz[1];
		dphi(0,6) = dx[1]*y[1]*z[1];
		dphi(1,6) = x[1]*dy[1]*z[1];
		dphi(2,6) = x[1]*y[1]*dz[1];
		dphi(0,7) = dx[0]*y[1]*z[1];
		dphi(1,7) = x[0]*dy[1]*z[1];
		dphi(2,7) = x[0]*y[1]*dz[1];
	}